

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O1

ssize_t http_decode_path(char *dest,char *url_data,size_t length)

{
  byte bVar1;
  byte bVar2;
  byte *pbVar3;
  byte *pbVar4;
  byte *pbVar5;
  char *pos;
  byte bVar6;
  
  pbVar3 = (byte *)dest;
  if (0 < (long)length) {
    pbVar4 = (byte *)url_data;
    do {
      pbVar5 = pbVar4 + 1;
      if (*pbVar4 == 0x25) {
        bVar1 = *pbVar5;
        bVar6 = bVar1 - 0x30;
        if (9 < bVar6) {
          if (0x25 < bVar1 - 0x41) {
            return -1;
          }
          if ((0x3f0000003fU >> ((ulong)(bVar1 - 0x41) & 0x3f) & 1) == 0) {
            return -1;
          }
          bVar6 = bVar1 + 0xa9;
        }
        *pbVar3 = bVar6 << 4;
        bVar1 = pbVar4[2];
        bVar2 = bVar1 - 0x30;
        if (9 < bVar2) {
          if (0x25 < bVar1 - 0x41) {
            return -1;
          }
          if ((0x3f0000003fU >> ((ulong)(bVar1 - 0x41) & 0x3f) & 1) == 0) {
            return -1;
          }
          bVar2 = (bVar1 | 0x20) + 0xa9;
        }
        *pbVar3 = bVar2 | bVar6 << 4;
        pbVar5 = pbVar4 + 3;
      }
      else {
        *pbVar3 = *pbVar4;
      }
      pbVar3 = pbVar3 + 1;
      pbVar4 = pbVar5;
    } while (pbVar5 < url_data + length);
  }
  *pbVar3 = 0;
  return (long)pbVar3 - (long)dest;
}

Assistant:

ssize_t http_decode_path(char *dest, const char *url_data, size_t length) {
  char *pos = dest;
  const char *end = url_data + length;
  while (url_data < end) {
    if (*url_data == '%') {
      // decode hex value
      // this is a percent encoded value.
      if (hex2byte((uint8_t *)pos, (uint8_t *)&url_data[1]))
        return -1;
      pos++;
      url_data += 3;
    } else
      *(pos++) = *(url_data++);
  }
  *pos = 0;
  return pos - dest;
}